

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O3

void ini_property_remove(ini_t *ini,int section,int property)

{
  ini_internal_property_t *piVar1;
  long lVar2;
  long lVar3;
  ini_internal_property_t *piVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  byte bVar8;
  
  bVar8 = 0;
  if (((-1 < section && ini != (ini_t *)0x0) && (section < ini->section_count)) &&
     (0 < (long)ini->property_count)) {
    piVar1 = ini->properties;
    lVar7 = 0;
    iVar5 = 0;
    do {
      if (*(int *)(piVar1->name + lVar7 + -4) == section) {
        if (iVar5 == property) {
          if (*(long *)(piVar1->value + lVar7 + 0x40) != 0) {
            (**ini->memctx)(*(long *)(piVar1->value + lVar7 + 0x40),0,0,0,0,0,
                            *(undefined8 *)((long)ini->memctx + 8));
            piVar1 = ini->properties;
          }
          if (*(long *)(piVar1->value + lVar7 + -8) != 0) {
            (**ini->memctx)(*(long *)(piVar1->value + lVar7 + -8),0,0,0,0,0,
                            *(undefined8 *)((long)ini->memctx + 8));
            piVar1 = ini->properties;
          }
          lVar2 = (long)ini->property_count + -1;
          ini->property_count = (int)lVar2;
          piVar4 = piVar1 + lVar2;
          pcVar6 = piVar1->name + lVar7 + -4;
          for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
            *(undefined8 *)pcVar6 = *(undefined8 *)piVar4;
            piVar4 = (ini_internal_property_t *)((long)piVar4 + (ulong)bVar8 * -0x10 + 8);
            pcVar6 = pcVar6 + ((ulong)bVar8 * -2 + 1) * 8;
          }
          return;
        }
        iVar5 = iVar5 + 1;
      }
      lVar7 = lVar7 + 0x78;
    } while ((long)ini->property_count * 0x78 - lVar7 != 0);
  }
  return;
}

Assistant:

void ini_property_remove( ini_t* ini, int section, int property )
    {
    int p;

    if( ini && section >= 0 && section < ini->section_count )
        {
        p = ini_internal_property_index( ini, section, property );
        if( p != INI_NOT_FOUND )
            {
            if( ini->properties[ p ].value_large ) INI_FREE( ini->memctx, ini->properties[ p ].value_large );
            if( ini->properties[ p ].name_large ) INI_FREE( ini->memctx, ini->properties[ p ].name_large );
            ini->properties[ p ] = ini->properties[ --ini->property_count  ];
            return;
            }
        }
    }